

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch2sin.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_10;
  double signal;
  ostringstream error_message_9;
  PeriodicWaveformGeneration waveform_generation;
  ostringstream error_message_8;
  InputSourceInterpolationWithMagicNumber input_source_interpolation_with_magic_number;
  InputSourceFromStream input_source_from_stream;
  istream *input_stream;
  ostringstream error_message_7;
  ifstream ifs;
  ostringstream error_message_6;
  char *input_file;
  ostringstream error_message_5;
  int num_input_files;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  int tmp;
  int max;
  int min;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool strict;
  double unvoiced_value;
  OutputFormats output_format;
  int interpolation_period;
  int frame_period;
  InputSourceInterpolationWithMagicNumber *in_stack_ffffffffffffe888;
  InputSourceInterpolationWithMagicNumber *in_stack_ffffffffffffe890;
  int in_stack_ffffffffffffe898;
  undefined2 in_stack_ffffffffffffe89c;
  undefined1 in_stack_ffffffffffffe89e;
  undefined1 in_stack_ffffffffffffe89f;
  PeriodicWaveformGeneration *in_stack_ffffffffffffe8a0;
  undefined7 in_stack_ffffffffffffe8d0;
  undefined1 in_stack_ffffffffffffe8d7;
  double *in_stack_ffffffffffffe8d8;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffe8e0;
  double *cos;
  undefined7 in_stack_ffffffffffffe8f0;
  PeriodicWaveformGeneration *in_stack_ffffffffffffe8f8;
  undefined8 in_stack_ffffffffffffe900;
  int in_stack_ffffffffffffe908;
  int in_stack_ffffffffffffe90c;
  InputSourceInterpolationWithMagicNumber *in_stack_ffffffffffffe910;
  InputSourceInterpolationWithMagicNumber *local_16d0;
  byte local_1642;
  bool local_1612;
  bool local_15ea;
  allocator<char> local_15c9;
  string local_15c8 [32];
  ostringstream local_15a8 [32];
  ostringstream *in_stack_ffffffffffffea78;
  string *in_stack_ffffffffffffea80;
  allocator local_1421;
  string local_1420 [32];
  ostringstream local_1400 [376];
  PeriodicWaveformGeneration local_1288;
  allocator local_1241;
  string local_1240 [32];
  ostringstream local_1220 [376];
  InputSourceInterpolationWithMagicNumber local_10a8;
  double *local_1000;
  undefined4 local_ff8;
  allocator local_ff1;
  string local_ff0 [32];
  ostringstream local_fd0 [376];
  double local_e58 [65];
  allocator local_c49;
  string local_c48 [32];
  ostringstream local_c28 [376];
  InputSourceInterpolationWithMagicNumber *local_ab0;
  allocator local_aa1;
  string local_aa0 [32];
  ostringstream local_a80 [376];
  int local_908;
  allocator local_901;
  string local_900 [32];
  ostringstream local_8e0 [383];
  allocator local_761;
  string local_760 [32];
  ostringstream local_740 [383];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [32];
  ostringstream local_578 [383];
  allocator local_3f9;
  string local_3f8 [32];
  int local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  allocator local_3c9;
  string local_3c8 [32];
  ostringstream local_3a8 [383];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  ostringstream local_1e0 [399];
  allocator local_51;
  string local_50 [32];
  int local_30;
  undefined1 local_29;
  undefined8 local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 100;
  local_18 = 1;
  local_1c = 0;
  local_28 = 0;
  local_29 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    local_30 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe8a0 >> 0x20),
                              (char **)CONCAT17(in_stack_ffffffffffffe89f,
                                                CONCAT16(in_stack_ffffffffffffe89e,
                                                         CONCAT24(in_stack_ffffffffffffe89c,
                                                                  in_stack_ffffffffffffe898))),
                              (char *)in_stack_ffffffffffffe890,(option *)in_stack_ffffffffffffe888,
                              (int *)0x1037b9);
    pcVar1 = ya_optarg;
    uVar4 = (undefined1)((ulong)in_stack_ffffffffffffe900 >> 0x38);
    if (local_30 == -1) break;
    switch(local_30) {
    case 0x68:
      anon_unknown.dwarf_ab2::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0));
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,pcVar1,&local_229);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffe89f,
                                  CONCAT16(in_stack_ffffffffffffe89e,
                                           CONCAT24(in_stack_ffffffffffffe89c,
                                                    in_stack_ffffffffffffe898))),
                         (int *)in_stack_ffffffffffffe890);
      local_1612 = !bVar2 || local_18 < 0;
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_1612) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        poVar5 = std::operator<<((ostream *)local_3a8,"The argument for the -i option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,"pitch2sin",&local_3c9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_ab2::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe8d7,in_stack_ffffffffffffe8d0));
      return 1;
    case 0x6f:
      local_3d0 = 0;
      local_3d4 = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,pcVar1,&local_3f9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffe89f,
                                  CONCAT16(in_stack_ffffffffffffe89e,
                                           CONCAT24(in_stack_ffffffffffffe89c,
                                                    in_stack_ffffffffffffe898))),
                         (int *)in_stack_ffffffffffffe890);
      local_1642 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d8,0,2);
        local_1642 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      if ((local_1642 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_578);
        poVar5 = std::operator<<((ostream *)local_578,
                                 "The argument for the -o option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_598,"pitch2sin",&local_599);
        sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::~allocator((allocator<char> *)&local_599);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_578);
        return local_4;
      }
      local_1c = local_3d8;
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar1,&local_51);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffe89f,
                                  CONCAT16(in_stack_ffffffffffffe89e,
                                           CONCAT24(in_stack_ffffffffffffe89c,
                                                    in_stack_ffffffffffffe898))),
                         (int *)in_stack_ffffffffffffe890);
      local_15ea = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (local_15ea) {
        std::__cxx11::ostringstream::ostringstream(local_1e0);
        std::operator<<((ostream *)local_1e0,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"pitch2sin",&local_201);
        sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e0);
        return local_4;
      }
      break;
    case 0x73:
      local_29 = 1;
      break;
    case 0x75:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,pcVar1,&local_5c1);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffe89f,
                                  CONCAT16(in_stack_ffffffffffffe89e,
                                           CONCAT24(in_stack_ffffffffffffe89c,
                                                    in_stack_ffffffffffffe898))),
                         (double *)in_stack_ffffffffffffe890);
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_740);
        std::operator<<((ostream *)local_740,"The argument for the -u option must be a number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_760,"pitch2sin",&local_761);
        sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
        std::__cxx11::string::~string(local_760);
        std::allocator<char>::~allocator((allocator<char> *)&local_761);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_740);
        return local_4;
      }
    }
  }
  if (local_14 / 2 < local_18) {
    std::__cxx11::ostringstream::ostringstream(local_8e0);
    poVar5 = std::operator<<((ostream *)local_8e0,
                             "Interpolation period must be equal to or less than half ");
    std::operator<<(poVar5,"frame period");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"pitch2sin",&local_901);
    sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8e0);
    return local_4;
  }
  local_908 = local_8 - ya_optind;
  if (1 < local_908) {
    std::__cxx11::ostringstream::ostringstream(local_a80);
    std::operator<<((ostream *)local_a80,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_aa0,"pitch2sin",&local_aa1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
    std::__cxx11::string::~string(local_aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a80);
    return local_4;
  }
  if (local_908 == 0) {
    local_16d0 = (InputSourceInterpolationWithMagicNumber *)0x0;
  }
  else {
    local_16d0 = *(InputSourceInterpolationWithMagicNumber **)(local_10 + (long)ya_optind * 8);
  }
  local_ab0 = local_16d0;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_c28);
    std::operator<<((ostream *)local_c28,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c48,"pitch2sin",&local_c49);
    sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
    std::__cxx11::string::~string(local_c48);
    std::allocator<char>::~allocator((allocator<char> *)&local_c49);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c28);
    return local_4;
  }
  std::ifstream::ifstream(local_e58);
  if (local_ab0 != (InputSourceInterpolationWithMagicNumber *)0x0) {
    in_stack_ffffffffffffe910 = local_ab0;
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_e58,(_Ios_Openmode)in_stack_ffffffffffffe910);
    bVar3 = std::ios::fail();
    in_stack_ffffffffffffe90c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffe90c);
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_fd0);
      poVar5 = std::operator<<((ostream *)local_fd0,"Cannot open file ");
      std::operator<<(poVar5,(char *)local_ab0);
      paVar6 = &local_ff1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ff0,"pitch2sin",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
      std::__cxx11::string::~string(local_ff0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
      local_4 = 1;
      local_ff8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_fd0);
      goto LAB_00104d57;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    cos = (double *)&std::cin;
  }
  else {
    cos = local_e58;
  }
  local_1000 = cos;
  sptk::InputSourceFromStream::InputSourceFromStream
            ((InputSourceFromStream *)in_stack_ffffffffffffe8a0,(bool)in_stack_ffffffffffffe89f,
             in_stack_ffffffffffffe898,(istream *)in_stack_ffffffffffffe890);
  sptk::InputSourceInterpolationWithMagicNumber::InputSourceInterpolationWithMagicNumber
            (in_stack_ffffffffffffe910,in_stack_ffffffffffffe90c,in_stack_ffffffffffffe908,
             (bool)uVar4,(double)in_stack_ffffffffffffe8f8,
             (InputSourceInterface *)CONCAT17(bVar3,in_stack_ffffffffffffe8f0));
  uVar4 = sptk::InputSourceInterpolationWithMagicNumber::IsValid(&local_10a8);
  if ((bool)uVar4) {
    sptk::PeriodicWaveformGeneration::PeriodicWaveformGeneration
              (in_stack_ffffffffffffe8a0,
               (double)CONCAT17(in_stack_ffffffffffffe89f,
                                CONCAT16(in_stack_ffffffffffffe89e,
                                         CONCAT24(in_stack_ffffffffffffe89c,
                                                  in_stack_ffffffffffffe898))),
               SUB81((ulong)in_stack_ffffffffffffe890 >> 0x38,0),in_stack_ffffffffffffe888);
    bVar2 = sptk::PeriodicWaveformGeneration::IsValid(&local_1288);
    if (bVar2) {
      do {
        bVar2 = sptk::PeriodicWaveformGeneration::Get
                          (in_stack_ffffffffffffe8f8,
                           (double *)CONCAT17(bVar3,in_stack_ffffffffffffe8f0),cos,
                           (double *)CONCAT17(uVar4,in_stack_ffffffffffffe8e0),
                           in_stack_ffffffffffffe8d8);
        if (!bVar2) {
          local_4 = 0;
          local_ff8 = 1;
          goto LAB_00104d01;
        }
        bVar2 = sptk::WriteStream<double>((double)in_stack_ffffffffffffe888,(ostream *)0x104bbe);
      } while (bVar2);
      std::__cxx11::ostringstream::ostringstream(local_15a8);
      std::operator<<((ostream *)local_15a8,"Failed to write a periodic waveform");
      in_stack_ffffffffffffe890 = (InputSourceInterpolationWithMagicNumber *)&local_15c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_15c8,"pitch2sin",(allocator *)in_stack_ffffffffffffe890);
      sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
      std::__cxx11::string::~string(local_15c8);
      std::allocator<char>::~allocator(&local_15c9);
      local_4 = 1;
      local_ff8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_15a8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1400);
      std::operator<<((ostream *)local_1400,"Failed to initialize PeriodicWaveformGeneration");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1420,"pitch2sin",&local_1421);
      sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
      std::__cxx11::string::~string(local_1420);
      std::allocator<char>::~allocator((allocator<char> *)&local_1421);
      local_4 = 1;
      local_ff8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1400);
    }
LAB_00104d01:
    sptk::PeriodicWaveformGeneration::~PeriodicWaveformGeneration(&local_1288);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1220);
    std::operator<<((ostream *)local_1220,"Failed to initialize InputSourceFromStream");
    paVar6 = &local_1241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1240,"pitch2sin",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
    std::__cxx11::string::~string(local_1240);
    std::allocator<char>::~allocator((allocator<char> *)&local_1241);
    local_4 = 1;
    local_ff8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1220);
  }
  sptk::InputSourceInterpolationWithMagicNumber::~InputSourceInterpolationWithMagicNumber
            (in_stack_ffffffffffffe890);
  sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x104d39);
LAB_00104d57:
  std::ifstream::~ifstream(local_e58);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);
  bool strict(kDefaultStrictFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "p:i:o:u:sh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        strict = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source_from_stream(false, 1, &input_stream);
  sptk::InputSourceInterpolationWithMagicNumber
      input_source_interpolation_with_magic_number(
          frame_period, interpolation_period, false,
          kMagicNumberForUnvoicedFrame, &input_source_from_stream);
  if (!input_source_interpolation_with_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  sptk::PeriodicWaveformGeneration waveform_generation(
      unvoiced_value, strict, &input_source_interpolation_with_magic_number);
  if (!waveform_generation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PeriodicWaveformGeneration";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  double signal;
  while (waveform_generation.Get(kSine == output_format ? &signal : NULL,
                                 kCosine == output_format ? &signal : NULL,
                                 kSawtooth == output_format ? &signal : NULL,
                                 NULL)) {
    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a periodic waveform";
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }

  return 0;
}